

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaB_collectgarbage(lua_State *L)

{
  int iVar1;
  int b_00;
  lua_Integer lVar2;
  int b;
  int res;
  int ex;
  int o;
  lua_State *L_local;
  
  iVar1 = luaL_checkoption(L,1,"collect",luaB_collectgarbage::opts);
  iVar1 = luaB_collectgarbage::optsnum[iVar1];
  lVar2 = luaL_optinteger(L,2,0);
  b_00 = lua_gc(L,iVar1,(int)lVar2);
  if (iVar1 == 3) {
    iVar1 = lua_gc(L,4,0);
    lua_pushnumber(L,(double)b_00 + (double)iVar1 / 1024.0);
  }
  else if ((iVar1 == 5) || (iVar1 == 9)) {
    lua_pushboolean(L,b_00);
  }
  else {
    lua_pushinteger(L,(long)b_00);
  }
  return 1;
}

Assistant:

static int luaB_collectgarbage(lua_State *L) {
    static const char *const opts[] = {"stop", "restart", "collect",
                                       "count", "step", "setpause", "setstepmul",
                                       "isrunning", NULL};
    static const int optsnum[] = {LUA_GCSTOP, LUA_GCRESTART, LUA_GCCOLLECT,
                                  LUA_GCCOUNT, LUA_GCSTEP, LUA_GCSETPAUSE, LUA_GCSETSTEPMUL,
                                  LUA_GCISRUNNING};
    int o = optsnum[luaL_checkoption(L, 1, "collect", opts)];
    int ex = (int) luaL_optinteger(L, 2, 0);
    int res = lua_gc(L, o, ex);
    switch (o) {
        case LUA_GCCOUNT: {
            int b = lua_gc(L, LUA_GCCOUNTB, 0);
            lua_pushnumber(L, (lua_Number) res + ((lua_Number) b / 1024));
            return 1;
        }
        case LUA_GCSTEP:
        case LUA_GCISRUNNING: {
            lua_pushboolean(L, res);
            return 1;
        }
        default: {
            lua_pushinteger(L, res);
            return 1;
        }
    }
}